

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

int init_altrace_playback(char *filename,void *userdata)

{
  char *pcVar1;
  FILE *__stream;
  uint32 uVar2;
  int *piVar3;
  char *pcVar4;
  bool bVar5;
  uint local_1c;
  int okay;
  void *userdata_local;
  char *filename_local;
  
  io_failure = 0;
  next_mapped_threadid = 0;
  trace_scope = 0;
  guserdata = userdata;
  logfd = open(filename,0);
  __stream = _stderr;
  pcVar1 = GAppName;
  bVar5 = logfd == -1;
  if (bVar5) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(__stream,"%s: Failed to open OpenAL log file \'%s\': %s\n",pcVar1,filename,pcVar4);
  }
  local_1c = (uint)!bVar5;
  fflush(_stderr);
  if (local_1c != 0) {
    uVar2 = IO_UINT32();
    if (uVar2 == 0x104e5a1) {
      uVar2 = IO_UINT32();
      if (uVar2 != 1) {
        fprintf(_stderr,"%s: File \'%s\' is an unsupported log file format version.\n",GAppName,
                filename);
        local_1c = 0;
      }
    }
    else {
      fprintf(_stderr,"%s: File \'%s\' does not appear to be an OpenAL log file.\n",GAppName,
              filename);
      local_1c = 0;
    }
  }
  if (local_1c == 0) {
    quit_altrace_playback();
  }
  return local_1c;
}

Assistant:

static int init_altrace_playback(const char *filename, void *userdata)
{
    int okay = 1;

    io_failure = 0;
    next_mapped_threadid = 0;
    trace_scope = 0;
    guserdata = userdata;

    logfd = open(filename, O_RDONLY);
    if (logfd == -1) {
        fprintf(stderr, "%s: Failed to open OpenAL log file '%s': %s\n", GAppName, filename, strerror(errno));
        okay = 0;
    }

    fflush(stderr);

    if (okay) {
        if (IO_UINT32() != ALTRACE_LOG_FILE_MAGIC) {
            fprintf(stderr, "%s: File '%s' does not appear to be an OpenAL log file.\n", GAppName, filename);
            okay = 0;
        } else if (IO_UINT32() != ALTRACE_LOG_FILE_FORMAT) {
            fprintf(stderr, "%s: File '%s' is an unsupported log file format version.\n", GAppName, filename);
            okay = 0;
        }
    }

    if (!okay) {
        quit_altrace_playback();
    }

    return okay;
}